

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O0

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::activeWait(parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
             *this)

{
  bool bVar1;
  reference this_00;
  __normal_iterator<oqpi::task_handle_*,_std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>_>
  *__rhs;
  task_handle *hTask;
  iterator __end2;
  iterator __begin2;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *__range2;
  parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *this_local;
  
  __end2 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::begin(&this->tasks_);
  hTask = (task_handle *)
          std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::end(&this->tasks_);
  while( true ) {
    __rhs = (__normal_iterator<oqpi::task_handle_*,_std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>_>
             *)&hTask;
    bVar1 = __gnu_cxx::operator!=(&__end2,__rhs);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<oqpi::task_handle_*,_std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>_>
              ::operator*(&__end2);
    bVar1 = task_handle::tryGrab(this_00);
    if (bVar1) {
      task_handle::execute(this_00);
    }
    __gnu_cxx::
    __normal_iterator<oqpi::task_handle_*,_std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>_>
    ::operator++(&__end2);
  }
  task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  ::wait(&this->
          super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
         ,__rhs);
  return;
}

Assistant:

virtual void activeWait() override final
        {
            for (auto &hTask : tasks_)
            {
                if (hTask.tryGrab())
                {
                    hTask.execute();
                }
            }

            this->wait();
        }